

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O0

size_t TdokuSolverDpllTriadSimd
                 (char *puzzle,size_t limit,uint32_t configuration,char *solution,
                 size_t *num_guesses)

{
  int in_EDX;
  long in_RSI;
  bool return_last;
  size_t *in_stack_000001c8;
  char *in_stack_000001d0;
  size_t in_stack_000001d8;
  char *in_stack_000001e0;
  SolverDpllTriadSimd<1> *in_stack_000001e8;
  size_t local_8;
  
  if (in_RSI == 1 || in_EDX != 0) {
    local_8 = anon_unknown.dwarf_11362::SolverDpllTriadSimd<1>::SolveSudoku
                        (in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,
                         in_stack_000001c8);
  }
  else {
    local_8 = anon_unknown.dwarf_11362::SolverDpllTriadSimd<0>::SolveSudoku
                        ((SolverDpllTriadSimd<0> *)in_stack_000001e8,in_stack_000001e0,
                         in_stack_000001d8,in_stack_000001d0,in_stack_000001c8);
  }
  return local_8;
}

Assistant:

size_t TdokuSolverDpllTriadSimd(const char *puzzle, size_t limit,
                                uint32_t configuration,
                                char *solution, size_t *num_guesses) {
    bool return_last = limit == 1 || configuration > 0;
    if (return_last) {
        return solver_last.SolveSudoku(puzzle, limit, solution, num_guesses);
    } else {
        return solver_none.SolveSudoku(puzzle, limit, solution, num_guesses);
    }
}